

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int tr_ilg(int n)

{
  if (0xffff < (uint)n) {
    if ((uint)n < 0x1000000) {
      return lg_table[(uint)n >> 0x10] + 0x10;
    }
    return lg_table[(uint)n >> 0x18] + 0x18;
  }
  if ((uint)n < 0x100) {
    return lg_table[(uint)n];
  }
  return lg_table[(uint)n >> 8] + 8;
}

Assistant:

static INLINE
int
tr_ilg(int n) {
  return (n & 0xffff0000) ?
          ((n & 0xff000000) ?
            24 + lg_table[(n >> 24) & 0xff] :
            16 + lg_table[(n >> 16) & 0xff]) :
          ((n & 0x0000ff00) ?
             8 + lg_table[(n >>  8) & 0xff] :
             0 + lg_table[(n >>  0) & 0xff]);
}